

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize
                 (seqStore_t *seqStore,ZSTD_CCtx *zc)

{
  symbolEncodingType_e sVar1;
  ZSTD_compressedBlockState_t *CTable;
  size_t sVar2;
  size_t sVar3;
  BYTE *codeTable;
  uint *count;
  ulong nbSeq;
  ulong sourceSize;
  U32 defaultMax;
  void *in_stack_ffffffffffffffa0;
  undefined4 uStack_58;
  uint maxSymbolValue;
  BYTE *local_50;
  uint *local_48;
  BYTE *local_40;
  BYTE *local_38;
  
  sVar2 = ZSTD_buildBlockEntropyStats
                    (seqStore,&((zc->blockState).prevCBlock)->entropy,
                     &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                     &(zc->blockSplitCtx).entropyMetadata,zc->entropyWorkspace,0x22d8);
  if (sVar2 < 0xffffffffffffff89) {
    sourceSize = (long)seqStore->lit - (long)seqStore->litStart;
    codeTable = seqStore->ofCode;
    local_40 = seqStore->llCode;
    local_38 = seqStore->mlCode;
    nbSeq = (long)seqStore->sequences - (long)seqStore->sequencesStart >> 3;
    CTable = (zc->blockState).nextCBlock;
    count = zc->entropyWorkspace;
    sVar1 = (zc->blockSplitCtx).entropyMetadata.hufMetadata.hType;
    maxSymbolValue = 0xff;
    if (sVar1 - set_compressed < 2) {
      in_stack_ffffffffffffffa0 = (void *)0x127609b;
      local_50 = codeTable;
      local_48 = count;
      sVar2 = HIST_count_wksp(count,&maxSymbolValue,seqStore->litStart,sourceSize,count,0x22d8);
      codeTable = local_50;
      count = local_48;
      if (sVar2 < 0xffffffffffffff89) {
        in_stack_ffffffffffffffa0 = (void *)0x12760b6;
        sVar2 = HUF_estimateCompressedSize((HUF_CElt *)CTable,local_48,maxSymbolValue);
        if (sVar1 == set_compressed) {
          sVar2 = sVar2 + (zc->blockSplitCtx).entropyMetadata.hufMetadata.hufDesSize;
        }
        sVar3 = sVar2 + 6;
        if (sourceSize < 0x100) {
          sVar3 = sVar2;
        }
        sourceSize = ((ulong)(0x3ff < sourceSize) - (ulong)(sourceSize < 0x4000)) + 4 + sVar3;
        codeTable = local_50;
        count = local_48;
      }
    }
    else if (sVar1 != set_basic) {
      if (sVar1 == set_rle) {
        sourceSize = 1;
      }
      else {
        sourceSize = 0;
      }
    }
    defaultMax = (U32)count;
    sVar2 = ZSTD_estimateBlockSize_symbolType
                      ((zc->blockSplitCtx).entropyMetadata.fseMetadata.ofType,codeTable,nbSeq,0x1f,
                       (CTable->entropy).fse.offcodeCTable,(U8 *)0x0,(short *)OF_defaultNorm,5,
                       defaultMax,in_stack_ffffffffffffffa0,CONCAT44(maxSymbolValue,uStack_58));
    local_40 = (BYTE *)ZSTD_estimateBlockSize_symbolType
                                 ((zc->blockSplitCtx).entropyMetadata.fseMetadata.llType,local_40,
                                  nbSeq,0x23,(CTable->entropy).fse.litlengthCTable,LL_bits,
                                  (short *)LL_defaultNorm,6,defaultMax,in_stack_ffffffffffffffa0,
                                  CONCAT44(maxSymbolValue,uStack_58));
    sVar3 = ZSTD_estimateBlockSize_symbolType
                      ((zc->blockSplitCtx).entropyMetadata.fseMetadata.mlType,local_38,nbSeq,0x34,
                       (CTable->entropy).fse.matchlengthCTable,ML_bits,(short *)ML_defaultNorm,6,
                       defaultMax,in_stack_ffffffffffffffa0,CONCAT44(maxSymbolValue,uStack_58));
    sVar2 = (zc->blockSplitCtx).entropyMetadata.fseMetadata.fseTablesSize +
            sVar2 + sourceSize + (long)local_40 + sVar3 +
            ((ulong)(0x7f < nbSeq) - (ulong)(nbSeq < 0x7f00)) + 6;
  }
  return sVar2;
}

Assistant:

static size_t
ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t* seqStore, ZSTD_CCtx* zc)
{
    ZSTD_entropyCTablesMetadata_t* const entropyMetadata = &zc->blockSplitCtx.entropyMetadata;
    DEBUGLOG(6, "ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize()");
    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(seqStore,
                    &zc->blockState.prevCBlock->entropy,
                    &zc->blockState.nextCBlock->entropy,
                    &zc->appliedParams,
                    entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE), "");
    return ZSTD_estimateBlockSize(
                    seqStore->litStart, (size_t)(seqStore->lit - seqStore->litStart),
                    seqStore->ofCode, seqStore->llCode, seqStore->mlCode,
                    (size_t)(seqStore->sequences - seqStore->sequencesStart),
                    &zc->blockState.nextCBlock->entropy,
                    entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE,
                    (int)(entropyMetadata->hufMetadata.hType == set_compressed), 1);
}